

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Own<kj::HttpClient,_std::nullptr_t> __thiscall
kj::newHttpClient(kj *this,Timer *timer,HttpHeaderTable *responseHeaderTable,NetworkAddress *addr,
                 HttpClientSettings *settings)

{
  NetworkAddressHttpClient *this_00;
  HttpClient *extraout_RDX;
  HttpClient *extraout_RDX_00;
  HttpClient *pHVar1;
  Own<kj::HttpClient,_std::nullptr_t> OVar2;
  Own<kj::NetworkAddress,_std::nullptr_t> local_70;
  HttpClientSettings local_60;
  
  this_00 = (NetworkAddressHttpClient *)operator_new(200);
  local_70.disposer = (Disposer *)&NullDisposer::instance;
  local_60.idleTimeout.value = (settings->idleTimeout).value;
  local_60.entropySource.ptr = (settings->entropySource).ptr;
  local_60.errorHandler.ptr = (settings->errorHandler).ptr;
  (settings->entropySource).ptr = (EntropySource *)0x0;
  (settings->errorHandler).ptr = (HttpClientErrorHandler *)0x0;
  local_60.webSocketCompressionMode = settings->webSocketCompressionMode;
  local_60.webSocketErrorHandler.ptr = (settings->webSocketErrorHandler).ptr;
  local_60.tlsContext.ptr = (settings->tlsContext).ptr;
  (settings->webSocketErrorHandler).ptr = (WebSocketErrorHandler *)0x0;
  (settings->tlsContext).ptr = (SecureNetworkWrapper *)0x0;
  local_70.ptr = addr;
  anon_unknown_36::NetworkAddressHttpClient::NetworkAddressHttpClient
            (this_00,timer,responseHeaderTable,&local_70,&local_60);
  pHVar1 = extraout_RDX;
  if (local_70.ptr != (NetworkAddress *)0x0) {
    (**(local_70.disposer)->_vptr_Disposer)
              (local_70.disposer,
               (local_70.ptr)->_vptr_NetworkAddress[-2] +
               (long)&(local_70.ptr)->_vptr_NetworkAddress);
    pHVar1 = extraout_RDX_00;
  }
  *(undefined8 **)this =
       &_::HeapDisposer<kj::(anonymous_namespace)::NetworkAddressHttpClient>::instance;
  *(NetworkAddressHttpClient **)(this + 8) = this_00;
  OVar2.ptr = pHVar1;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

kj::Own<HttpClient> newHttpClient(kj::Timer& timer, const HttpHeaderTable& responseHeaderTable,
                                  kj::NetworkAddress& addr, HttpClientSettings settings) {
  return kj::heap<NetworkAddressHttpClient>(timer, responseHeaderTable,
      kj::Own<kj::NetworkAddress>(&addr, kj::NullDisposer::instance), kj::mv(settings));
}